

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O3

void CheckMaybeEscapedUse(ParseNode *pnode,ByteCodeGenerator *byteCodeGenerator,bool isCall)

{
  OpCode OVar1;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *this;
  bool bVar2;
  Type *ppFVar3;
  ParseNodeBin *pPVar4;
  ParseNodeName *pPVar5;
  Type this_00;
  
  if (pnode != (ParseNode *)0x0) {
    this = byteCodeGenerator->funcInfoStack;
    if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
        (this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
        super_SListNodeBase<Memory::ArenaAllocator>.next == this) {
      this_00 = (FuncInfo *)0x0;
    }
    else {
      ppFVar3 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                          (&this->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
      this_00 = *ppFVar3;
    }
    bVar2 = FuncInfo::IsGlobalFunction(this_00);
    if (!bVar2) {
      OVar1 = pnode->nop;
      if (OVar1 == knopName) {
        if (isCall) {
          return;
        }
      }
      else {
        if (OVar1 == knopFncDecl) {
          FuncInfo::SetHasMaybeEscapedNestedFunc(this_00,L"UnknownUse");
          return;
        }
        if (OVar1 != knopAsg) {
          return;
        }
        pPVar4 = ParseNode::AsParseNodeBin(pnode);
        if (pPVar4->pnode1->nop != knopName) {
          return;
        }
        pPVar4 = ParseNode::AsParseNodeBin(pnode);
        pnode = pPVar4->pnode1;
      }
      pPVar5 = ParseNode::AsParseNodeName(pnode);
      if (pPVar5->sym != (Symbol *)0x0) {
        pPVar5 = ParseNode::AsParseNodeName(pnode);
        Symbol::SetHasMaybeEscapedUse(pPVar5->sym,byteCodeGenerator);
        return;
      }
    }
  }
  return;
}

Assistant:

void CheckMaybeEscapedUse(ParseNode * pnode, ByteCodeGenerator * byteCodeGenerator, bool isCall = false)
{
    if (pnode == nullptr)
    {
        return;
    }

    FuncInfo * topFunc = byteCodeGenerator->TopFuncInfo();
    if (topFunc->IsGlobalFunction())
    {
        return;
    }

    switch (pnode->nop)
    {
    case knopAsg:
        if (pnode->AsParseNodeBin()->pnode1->nop != knopName)
        {
            break;
        }
        // use of an assignment (e.g. (y = function() {}) + "1"), just make y an escaped use.
        pnode = pnode->AsParseNodeBin()->pnode1;
        isCall = false;
        // fall-through
    case knopName:
        if (!isCall)
        {
            // Mark the name has having escaped use
            if (pnode->AsParseNodeName()->sym)
            {
                pnode->AsParseNodeName()->sym->SetHasMaybeEscapedUse(byteCodeGenerator);
            }
        }
        break;

    case knopFncDecl:
        // A function declaration has an unknown use (not assignment nor call),
        // mark the function as having child escaped
        topFunc->SetHasMaybeEscapedNestedFunc(DebugOnly(_u("UnknownUse")));
        break;
    }
}